

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

container_t * ra_get_container(roaring_array_t *ra,uint16_t x,uint8_t *typecode)

{
  uint uVar1;
  container_t *pcVar2;
  
  uVar1 = binarySearch(ra->keys,ra->size,x);
  if ((int)uVar1 < 0) {
    pcVar2 = (container_t *)0x0;
  }
  else {
    *typecode = ra->typecodes[uVar1];
    pcVar2 = ra->containers[uVar1];
  }
  return pcVar2;
}

Assistant:

container_t *ra_get_container(roaring_array_t *ra, uint16_t x,
                              uint8_t *typecode) {
    int i = binarySearch(ra->keys, (int32_t)ra->size, x);
    if (i < 0) return NULL;
    *typecode = ra->typecodes[i];
    return ra->containers[i];
}